

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

void helicsInputSetDefaultComplexVector
               (HelicsInput inp,double *vectorInput,int vectorLength,HelicsError *err)

{
  int in_EDX;
  long in_RSI;
  ptrdiff_t ii;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec;
  InputObject *inpObj;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffff68;
  Input *in_stack_ffffffffffffff70;
  Input *this;
  double *in_stack_ffffffffffffff78;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffff80;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this_00;
  long local_78;
  undefined1 local_70 [8];
  Core *in_stack_ffffffffffffff98;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_ffffffffffffffa0;
  undefined8 local_48;
  undefined8 uStack_40;
  ValueFederate *local_38;
  InputObject *local_28;
  int local_14;
  long local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_28 = anon_unknown.dwarf_5d1c2::verifyInput
                       (in_stack_ffffffffffffff78,(HelicsError *)in_stack_ffffffffffffff70);
  if (local_28 != (InputObject *)0x0) {
    if ((local_10 == 0) || (local_14 < 1)) {
      local_48 = (pointer)0x0;
      uStack_40 = (pointer)0x0;
      local_38 = (ValueFederate *)0x0;
      this_00 = (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                &stack0xffffffffffffffb8;
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x1d052a);
      helics::Input::
      setDefault<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector(this_00);
    }
    else {
      this = (Input *)local_70;
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::vector
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)0x1d0576);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
                (in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
      for (local_78 = 0; local_78 < local_14; local_78 = local_78 + 1) {
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        emplace_back<double_const&,double_const&>
                  (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(double *)this);
      }
      helics::Input::
      setDefault<std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
                (this,in_stack_ffffffffffffff68);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
                (in_stack_ffffffffffffff80);
    }
  }
  return;
}

Assistant:

void helicsInputSetDefaultComplexVector(HelicsInput inp, const double* vectorInput, int vectorLength, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    try {
        if ((vectorInput == nullptr) || (vectorLength <= 0)) {
            inpObj->inputPtr->setDefault(std::vector<std::complex<double>>{});
        } else {
            std::vector<std::complex<double>> cvec;
            cvec.reserve(vectorLength);
            for (std::ptrdiff_t ii = 0; ii < vectorLength; ++ii) {
                cvec.emplace_back(vectorInput[2 * ii], vectorInput[2 * ii + 1]);
            }
            inpObj->inputPtr->setDefault(std::move(cvec));
        }
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}